

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

void __thiscall Glucose::Solver::adaptSolver(Solver *this)

{
  ulong uVar1;
  unsigned_long uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  unsigned_long *puVar7;
  Clause *this_00;
  uint *puVar8;
  vec<unsigned_int> *this_01;
  long in_RDI;
  float cr;
  int i_1;
  Clause *c;
  int j;
  int i;
  int moved;
  float decpc;
  bool reinit;
  bool adjusted;
  uint *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff84;
  float local_4c;
  undefined1 in_stack_ffffffffffffffcb;
  float fVar9;
  int index;
  int local_1c;
  int local_18;
  bool local_9;
  
  cr = (float)(long)*(ulong *)(in_RDI + 0xf0);
  fVar9 = (float)*(ulong *)(in_RDI + 0xf0);
  local_4c = (float)*(ulong *)(in_RDI + 0x100);
  bVar3 = fVar9 / local_4c <= 1.2;
  if (bVar3) {
    *(undefined1 *)(in_RDI + 0x68) = 1;
    *(undefined4 *)(in_RDI + 0x6c) = 4;
    *(undefined1 *)(in_RDI + 0x118) = 1;
    *(undefined4 *)(in_RDI + 0x58) = 2000;
    *(undefined4 *)(in_RDI + 0x358) = *(undefined4 *)(in_RDI + 0x58);
    *(ulong *)(in_RDI + 0x110) =
         *(ulong *)(in_RDI + 0x100) / (ulong)(long)*(int *)(in_RDI + 0x358) + 1;
    *(undefined4 *)(in_RDI + 0x5c) = 0;
  }
  puVar7 = vec<unsigned_long>::operator[]((vec<unsigned_long> *)(in_RDI + 0xd0),0x17);
  uVar1 = *puVar7;
  if (uVar1 < 30000) {
    *(undefined1 *)(in_RDI + 0x120) = 1;
    *(undefined4 *)(in_RDI + 0x124) = 100;
    *(undefined8 *)(in_RDI + 0x78) = 0x3feff7ced916872b;
    *(undefined8 *)(in_RDI + 0x80) = 0x3feff7ced916872b;
  }
  local_9 = uVar1 < 30000 || bVar3;
  puVar7 = vec<unsigned_long>::operator[]((vec<unsigned_long> *)(in_RDI + 0xd0),0x17);
  if (0xd480 < *puVar7) {
    *(undefined1 *)(in_RDI + 0x68) = 1;
    *(undefined1 *)(in_RDI + 0x118) = 1;
    *(undefined4 *)(in_RDI + 0x6c) = 3;
    *(undefined4 *)(in_RDI + 0x58) = 30000;
    *(undefined8 *)(in_RDI + 0x78) = 0x3fefae147ae147ae;
    *(undefined8 *)(in_RDI + 0x80) = 0x3fefae147ae147ae;
    *(undefined1 *)(in_RDI + 0x128) = 1;
    local_9 = true;
  }
  puVar7 = vec<unsigned_long>::operator[]((vec<unsigned_long> *)(in_RDI + 0xd0),10);
  uVar2 = *puVar7;
  puVar7 = vec<unsigned_long>::operator[]((vec<unsigned_long> *)(in_RDI + 0xd0),0xb);
  if (20000 < uVar2 - *puVar7) {
    *(undefined8 *)(in_RDI + 0x78) = 0x3fed1eb851eb851f;
    *(undefined8 *)(in_RDI + 0x80) = 0x3fed1eb851eb851f;
    local_9 = true;
  }
  if (local_9) {
    bqueue<unsigned_int>::fastclear((bqueue<unsigned_int> *)(in_RDI + 0x3a0));
    *(undefined4 *)(in_RDI + 0x3e0) = 0;
    *(undefined8 *)(in_RDI + 0x108) = 0;
  }
  if (((*(byte *)(in_RDI + 0x68) & 1) != 0) && (local_9)) {
    local_1c = 0;
    for (local_18 = 0; iVar4 = vec<unsigned_int>::size((vec<unsigned_int> *)(in_RDI + 0x218)),
        local_18 < iVar4; local_18 = local_18 + 1) {
      vec<unsigned_int>::operator[]((vec<unsigned_int> *)(in_RDI + 0x218),local_18);
      this_00 = ClauseAllocator::operator[]
                          ((ClauseAllocator *)
                           CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                           (Ref)((ulong)in_stack_ffffffffffffff78 >> 0x20));
      uVar5 = Clause::lbd(this_00);
      if (*(uint *)(in_RDI + 0x6c) < uVar5) {
        puVar8 = vec<unsigned_int>::operator[]((vec<unsigned_int> *)(in_RDI + 0x218),local_18);
        in_stack_ffffffffffffff84 = *puVar8;
        puVar8 = vec<unsigned_int>::operator[]((vec<unsigned_int> *)(in_RDI + 0x218),local_1c);
        *puVar8 = in_stack_ffffffffffffff84;
        local_1c = local_1c + 1;
      }
      else {
        vec<unsigned_int>::operator[]((vec<unsigned_int> *)(in_RDI + 0x218),local_18);
        vec<unsigned_int>::push
                  ((vec<unsigned_int> *)
                   CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   in_stack_ffffffffffffff78);
      }
    }
    vec<unsigned_int>::shrink((vec<unsigned_int> *)(in_RDI + 0x218),local_18 - local_1c);
  }
  if (bVar3) {
    iVar4 = 0;
    while (index = iVar4, iVar6 = vec<unsigned_int>::size((vec<unsigned_int> *)(in_RDI + 0x218)),
          iVar4 < iVar6) {
      vec<unsigned_int>::operator[]((vec<unsigned_int> *)(in_RDI + 0x218),index);
      removeClause((Solver *)CONCAT44(index,fVar9),(CRef)cr,(bool)in_stack_ffffffffffffffcb);
      iVar4 = index + 1;
    }
    this_01 = (vec<unsigned_int> *)(in_RDI + 0x218);
    iVar4 = vec<unsigned_int>::size((vec<unsigned_int> *)(in_RDI + 0x218));
    vec<unsigned_int>::shrink(this_01,iVar4);
    checkGarbage((Solver *)0x11dd70);
  }
  return;
}

Assistant:

void Solver::adaptSolver() {
    bool adjusted = false;
    bool reinit = false;
    // printf("c\nc Try to adapt solver strategies\nc \n");
    /*  printf("c Adjusting solver for the SAT Race 2015 (alpha feature)\n");
    printf("c key successive Conflicts       : %" PRIu64"\n",stats[noDecisionConflict]);
    printf("c nb unary clauses learnt        : %" PRIu64"\n",stats[nbUn]);
    printf("c key avg dec per conflicts      : %.2f\n", (float)decisions / (float)conflicts);*/
    float decpc = (float) decisions / (float) conflicts;
    if(decpc <= 1.2) {
        chanseokStrategy = true;
        coLBDBound = 4;
        glureduce = true;
        adjusted = true;
        // printf("c Adjusting for low decision levels.\n");
        reinit = true;
        firstReduceDB = 2000;
        nbclausesbeforereduce = firstReduceDB;
        curRestart = (conflicts / nbclausesbeforereduce) + 1;
        incReduceDB = 0;
    }
    if(stats[noDecisionConflict] < 30000) {
        luby_restart = true;
        luby_restart_factor = 100;

        var_decay = 0.999;
        max_var_decay = 0.999;
        adjusted = true;
        // printf("c Adjusting for low successive conflicts.\n");
    }
    if(stats[noDecisionConflict] > 54400) {
        // printf("c Adjusting for high successive conflicts.\n");
        chanseokStrategy = true;
        glureduce = true;
        coLBDBound = 3;
        firstReduceDB = 30000;
        var_decay = 0.99;
        max_var_decay = 0.99;
        randomize_on_restarts = 1;
        adjusted = true;
    }
    if(stats[nbDL2] - stats[nbBin] > 20000) {
        var_decay = 0.91;
        max_var_decay = 0.91;
        adjusted = true;
        // printf("c Adjusting for a very large number of true glue clauses found.\n");
    }
    if(!adjusted) {
        // printf("c Nothing extreme in this problem, continue with glucose default strategies.\n");
    }
    // printf("c\n");
    if(adjusted) { // Let's reinitialize the glucose restart strategy counters
        lbdQueue.fastclear();
        sumLBD = 0;
        conflictsRestarts = 0;
    }

    if(chanseokStrategy && adjusted) {
        int moved = 0;
        int i, j;
        for(i = j = 0; i < learnts.size(); i++) {
            Clause &c = ca[learnts[i]];
            if(c.lbd() <= coLBDBound) {
                permanentLearnts.push(learnts[i]);
                moved++;
            }
            else {
                learnts[j++] = learnts[i];
            }
        }
        learnts.shrink(i - j);
        // printf("c Activating Chanseok Strategy: moved %d clauses to the permanent set.\n", moved);
    }

    if(reinit) {
        assert(decisionLevel() == 0);
        for(int i = 0; i < learnts.size(); i++) {
            removeClause(learnts[i]);
        }
        learnts.shrink(learnts.size());
        checkGarbage();
/*
	order_heap.clear();
	for(int i=0;i<nVars();i++) {
	    polarity[i] = true; 
	    activity[i]=0.0;
	    if (decision[i]) order_heap.insert(i);
	}
	printf("c reinitialization of all variables activity/phase/learnt clauses.\n");
*/
        // printf("c Removing of non permanent clauses.\n");
    }

}